

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

int symtab_put(symtab *tab,char *cname,int type,int data)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  char *str;
  symtab_sym *psVar4;
  int *piVar5;
  uint uVar6;
  int local_58;
  int i;
  int res;
  int bucket;
  uint32_t hash;
  symtab_sym sym;
  char *name;
  int data_local;
  int type_local;
  char *cname_local;
  symtab *tab_local;
  
  iVar2 = symtab_get(tab,cname,(int *)0x0,(int *)0x0);
  if (iVar2 == -1) {
    str = strdup(cname);
    uVar3 = elf_hash(str);
    uVar6 = uVar3 % (uint)tab->bucketsnum;
    tab_local._4_4_ = tab->symsnum;
    iVar2 = tab->buckets[(int)uVar6];
    tab->buckets[(int)uVar6] = tab_local._4_4_;
    if (tab->symsmax <= tab->symsnum) {
      if (tab->symsmax == 0) {
        tab->symsmax = 0x10;
      }
      else {
        tab->symsmax = tab->symsmax << 1;
      }
      psVar4 = (symtab_sym *)realloc(tab->syms,(long)tab->symsmax * 0x18);
      tab->syms = psVar4;
    }
    iVar1 = tab->symsnum;
    tab->symsnum = iVar1 + 1;
    psVar4 = tab->syms + iVar1;
    psVar4->name = str;
    psVar4->hash = uVar3;
    psVar4->hchain = iVar2;
    psVar4->type = type;
    psVar4->data = data;
    if ((tab->bucketsnum < tab->symsnum) && (tab->bucketsnum != 0x10000000)) {
      free(tab->buckets);
      for (local_58 = 0; (local_58 < 0xb && (primes[local_58] < tab->symsnum));
          local_58 = local_58 + 1) {
      }
      tab->bucketsnum = primes[local_58];
      piVar5 = (int *)malloc((long)tab->bucketsnum << 2);
      tab->buckets = piVar5;
      for (local_58 = 0; local_58 < tab->bucketsnum; local_58 = local_58 + 1) {
        tab->buckets[local_58] = -1;
      }
      for (local_58 = 0; local_58 < tab->symsnum; local_58 = local_58 + 1) {
        uVar6 = tab->syms[local_58].hash % (uint)tab->bucketsnum;
        tab->syms[local_58].hchain = tab->buckets[(int)uVar6];
        tab->buckets[(int)uVar6] = local_58;
      }
    }
  }
  else {
    tab_local._4_4_ = -1;
  }
  return tab_local._4_4_;
}

Assistant:

int symtab_put(struct symtab *tab, const char *cname, int type, int data) {
	if (symtab_get(tab, cname, 0, 0) != -1)
		return -1;
	char *name = strdup(cname);
	struct symtab_sym sym;
	uint32_t hash = elf_hash(name);
	int bucket = hash % tab->bucketsnum;
	int res = tab->symsnum;
	sym.name = name;
	sym.type = type;
	sym.data = data;
	sym.hash = hash;
	sym.hchain = tab->buckets[bucket];
	tab->buckets[bucket] = res;
	ADDARRAY(tab->syms, sym);
	if (tab->symsnum > tab->bucketsnum && tab->bucketsnum != primes[numprimes-1]) {
		/* rehash */
		int i;
		free(tab->buckets);
		for (i = 0; i < numprimes-1; i++)
			if (tab->symsnum <= primes[i])
				break;
		tab->bucketsnum = primes[i];
		tab->buckets = malloc(tab->bucketsnum * sizeof *tab->buckets);
		for (i = 0; i < tab->bucketsnum; i++)
			tab->buckets[i] = -1;
		for (i = 0; i < tab->symsnum; i++) {
			bucket = tab->syms[i].hash % tab->bucketsnum;
			tab->syms[i].hchain = tab->buckets[bucket];
			tab->buckets[bucket] = i;
		}
	}
	return res;
}